

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::texture::util::
TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance>::createInstance
          (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance> *this,
          Context *context)

{
  Context **this_00;
  Context **this_01;
  deInt32 *pdVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  Context *pCVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  TestInstance *pTVar8;
  TextureFormat this_02;
  long lVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  Context *pCVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  int iVar16;
  Context *pCVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  deUint32 step;
  Vec4 local_e8;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  float afStack_c8 [3];
  int local_bc;
  void *local_b8;
  undefined8 uStack_b0;
  undefined4 local_a8;
  uint local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  Vec4 local_40;
  
  pTVar8 = (TestInstance *)operator_new(0x288);
  pTVar8->m_context = context;
  pTVar8->_vptr_TestInstance = (_func_int **)&PTR__Texture2DShadowTestInstance_00d68010;
  pTVar8[1]._vptr_TestInstance = (_func_int **)&this->m_testsParameters;
  this_00 = &pTVar8[1].m_context;
  this_01 = &pTVar8[4].m_context;
  pTVar8[1].m_context = (Context *)0x0;
  pTVar8[2]._vptr_TestInstance = (_func_int **)0x0;
  pTVar8[2].m_context = (Context *)0x0;
  pTVar8[3]._vptr_TestInstance = (_func_int **)0x0;
  pTVar8[3].m_context = (Context *)0x0;
  pTVar8[4]._vptr_TestInstance = (_func_int **)0x0;
  TextureRenderer::TextureRenderer
            ((TextureRenderer *)this_01,context,
             (this->m_testsParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,0x40,0x40);
  *(undefined4 *)&pTVar8[0x28]._vptr_TestInstance = 0;
  std::
  vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
  ::reserve((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,_std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>_>_>
             *)this_00,2);
  iVar16 = 1;
  do {
    this_02 = (TextureFormat)operator_new(0x70);
    local_e8.m_data._0_8_ = ::vk::mapVkFormat(*(VkFormat *)(pTVar8[1]._vptr_TestInstance + 3));
    vkt::pipeline::TestTexture2D::TestTexture2D
              ((TestTexture2D *)this_02,(TextureFormat *)&local_e8,
               *(int *)(pTVar8[1]._vptr_TestInstance + 7),
               *(int *)((long)pTVar8[1]._vptr_TestInstance + 0x3c));
    uStack_d0 = (SharedPtrStateBase *)0x0;
    local_d8 = (undefined1  [8])this_02;
    uStack_d0 = (SharedPtrStateBase *)operator_new(0x20);
    uStack_d0->strongRefCount = 0;
    uStack_d0->weakRefCount = 0;
    uStack_d0->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d67150;
    uStack_d0[1]._vptr_SharedPtrStateBase = (_func_int **)this_02;
    uStack_d0->strongRefCount = 1;
    uStack_d0->weakRefCount = 1;
    std::
    vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
    ::emplace_back<de::SharedPtr<vkt::pipeline::TestTexture2D>>
              ((vector<de::SharedPtr<vkt::pipeline::TestTexture2D>,std::allocator<de::SharedPtr<vkt::pipeline::TestTexture2D>>>
                *)this_00,(SharedPtr<vkt::pipeline::TestTexture2D> *)local_d8);
    if (uStack_d0 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &uStack_d0->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_d8._0_4_ = R;
        local_d8._4_4_ = SNORM_INT8;
        (*uStack_d0->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &uStack_d0->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if (uStack_d0 != (SharedPtrStateBase *)0x0) {
          (*uStack_d0->_vptr_SharedPtrStateBase[1])();
        }
        uStack_d0 = (SharedPtrStateBase *)0x0;
      }
    }
    iVar16 = iVar16 + -1;
  } while (iVar16 == 0);
  iVar16 = (*(code *)(*this_00)->m_testCtx->m_platform[2]._vptr_Platform)();
  if (0 < iVar16) {
    iVar18 = 0;
    do {
      (*(code *)(*this_00)->m_testCtx->m_platform[7]._vptr_Platform)
                ((PixelBufferAccess *)local_d8,(*this_00)->m_testCtx,iVar18,0);
      local_e8.m_data[0] = -0.5;
      local_e8.m_data[1] = -0.5;
      local_e8.m_data[2] = -0.5;
      local_e8.m_data[3] = 2.0;
      local_40.m_data[0] = 1.0;
      local_40.m_data[1] = 1.0;
      local_40.m_data[2] = 1.0;
      local_40.m_data[3] = 0.0;
      tcu::fillWithComponentGradients((PixelBufferAccess *)local_d8,&local_e8,&local_40);
      iVar18 = iVar18 + 1;
    } while (iVar16 != iVar18);
    if (0 < iVar16) {
      iVar18 = 0;
      do {
        (**(code **)(*(long *)&((*this_00)->m_progCollection->m_programs)._M_t._M_impl + 0x38))
                  ((PixelBufferAccess *)local_d8,(*this_00)->m_progCollection,iVar18,0);
        tcu::RGBA::toVec((RGBA *)&local_e8);
        tcu::RGBA::toVec((RGBA *)&local_40);
        tcu::fillWithGrid((PixelBufferAccess *)local_d8,4,&local_e8,&local_40);
        iVar18 = iVar18 + 1;
      } while (iVar16 != iVar18);
    }
  }
  for (pCVar17 = pTVar8[1].m_context; pCVar17 != (Context *)pTVar8[2]._vptr_TestInstance;
      pCVar17 = (Context *)&pCVar17->m_progCollection) {
    TextureRenderer::add2DTexture((TextureRenderer *)this_01,(TestTexture2DSp *)pCVar17);
  }
  local_bc = 0;
  bVar20 = *(int *)(pTVar8[1]._vptr_TestInstance + 8) - 5U < 2;
  if (!bVar20) {
    local_bc = 0x3f000000;
  }
  local_d8 = (undefined1  [8])((ulong)*(uint *)(&DAT_00b84860 + (ulong)bVar20 * 4) << 0x20);
  uStack_d0 = (SharedPtrStateBase *)0x4039999a3fcccccd;
  afStack_c8[0] = -1.0;
  afStack_c8[1] = -2.7;
  afStack_c8[2] = 0.0;
  local_b8 = (void *)0xbfaccccdc0000000;
  uStack_b0 = 0x3f333333be4ccccd;
  local_a8 = 1;
  local_a4 = *(uint *)(&DAT_00b84860 + (ulong)bVar20 * 4);
  local_a0 = 0x3e8ccccd3e0f5c29;
  uStack_98 = 0xbf8ccccdbfc00000;
  local_90 = 1;
  local_8c = local_bc;
  local_88 = 0xc028f5c3bf6b851f;
  uStack_80 = 0xbdcccccd3ecccccd;
  local_78 = 1;
  local_74 = 0xbec7ae143f8ccccd;
  uStack_6c = 0x3f266666bf051eb8;
  local_64 = 0x13f5eb852;
  local_5c = 0xbfc66666bdcccccd;
  uStack_54 = 0x3eb333333f266666;
  local_4c = 0x3f68f5c3;
  lVar19 = 0;
  do {
    iVar16 = *(int *)(local_d8 + lVar19 * 0x18);
    iVar18 = (int)((ulong)((long)pTVar8[2]._vptr_TestInstance - (long)pTVar8[1].m_context) >> 4) +
             -1;
    if (iVar16 < iVar18) {
      iVar18 = iVar16;
    }
    if (iVar16 < 0) {
      iVar18 = 0;
    }
    uVar2 = *(undefined4 *)(local_d8 + lVar19 * 0x18 + 4);
    fVar22 = *(float *)((long)&uStack_d0 + lVar19 * 0x18 + 4);
    fVar3 = afStack_c8[lVar19 * 6];
    fVar4 = afStack_c8[lVar19 * 6 + 1];
    fVar21 = expf(*(float *)(&uStack_d0 + lVar19 * 3) * 0.6931472);
    dVar6 = TextureRenderer::getRenderWidth((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(long)iVar18 * 2]->m_platform[0x11]._vptr_Platform)()
    ;
    iVar16 = *(int *)(lVar9 + 0x38);
    fVar22 = expf(fVar22 * 0.6931472);
    dVar7 = TextureRenderer::getRenderHeight((TextureRenderer *)this_01);
    lVar9 = (*(code *)(&(*this_00)->m_testCtx)[(long)iVar18 * 2]->m_platform[0x11]._vptr_Platform)()
    ;
    fVar21 = (fVar21 * (float)dVar6) / (float)iVar16 + fVar3;
    fVar22 = (fVar22 * (float)dVar7) / (float)*(int *)(lVar9 + 0x3c) + fVar4;
    pCVar17 = pTVar8[3].m_context;
    if (pCVar17 == (Context *)pTVar8[4]._vptr_TestInstance) {
      pCVar5 = (Context *)pTVar8[3]._vptr_TestInstance;
      if ((long)pCVar17 - (long)pCVar5 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar9 = (long)pCVar17 - (long)pCVar5 >> 3;
      uVar15 = lVar9 * -0x5555555555555555;
      uVar10 = uVar15;
      if (pCVar17 == pCVar5) {
        uVar10 = 1;
      }
      uVar13 = uVar10 + uVar15;
      if (0x555555555555554 < uVar13) {
        uVar13 = 0x555555555555555;
      }
      if (CARRY8(uVar10,uVar15)) {
        uVar13 = 0x555555555555555;
      }
      if (uVar13 == 0) {
        pp_Var11 = (_func_int **)0x0;
      }
      else {
        pp_Var11 = (_func_int **)operator_new(uVar13 * 0x18);
      }
      *(int *)(pp_Var11 + lVar9) = iVar18;
      *(float *)((long)pp_Var11 + (lVar9 * 2 + 1) * 4) = fVar3;
      *(float *)(pp_Var11 + lVar9 + 1) = fVar4;
      *(float *)((long)pp_Var11 + (lVar9 * 2 + 3) * 4) = fVar21;
      *(float *)(pp_Var11 + lVar9 + 2) = fVar22;
      *(undefined4 *)((long)pp_Var11 + (lVar9 * 2 + 5) * 4) = uVar2;
      pp_Var14 = pp_Var11;
      for (pCVar12 = pCVar5; pCVar17 != pCVar12; pCVar12 = (Context *)&pCVar12->m_device) {
        *(undefined4 *)pp_Var14 = *(undefined4 *)&pCVar12->m_testCtx;
        lVar9 = 1;
        do {
          *(undefined4 *)((long)pp_Var14 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar12->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 2);
        lVar9 = 3;
        do {
          *(undefined4 *)((long)pp_Var14 + lVar9 * 4) =
               *(undefined4 *)((long)&pCVar12->m_testCtx + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 4);
        *(undefined4 *)((long)pp_Var14 + 0x14) =
             *(undefined4 *)((long)&pCVar12->m_progCollection + 4);
        pp_Var14 = pp_Var14 + 3;
      }
      if (pCVar5 != (Context *)0x0) {
        operator_delete(pCVar5,(long)pTVar8[4]._vptr_TestInstance - (long)pCVar5);
      }
      pTVar8[3]._vptr_TestInstance = pp_Var11;
      pTVar8[3].m_context = (Context *)(pp_Var14 + 3);
      pTVar8[4]._vptr_TestInstance = pp_Var11 + uVar13 * 3;
    }
    else {
      *(int *)&pCVar17->m_testCtx = iVar18;
      *(float *)((long)&pCVar17->m_testCtx + 4) = fVar3;
      *(float *)&pCVar17->m_platformInterface = fVar4;
      *(float *)((long)&pCVar17->m_platformInterface + 4) = fVar21;
      *(float *)&pCVar17->m_progCollection = fVar22;
      *(undefined4 *)((long)&pCVar17->m_progCollection + 4) = uVar2;
      pTVar8[3].m_context = (Context *)&pCVar17->m_device;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 6);
  *(undefined4 *)&pTVar8[0x28]._vptr_TestInstance = 0;
  return pTVar8;
}

Assistant:

virtual TestInstance*				createInstance				(Context& context) const
										{
											return new INSTANCE_TYPE(context, m_testsParameters);
										}